

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QTextEdit::ExtraSelection>::end(QList<QTextEdit::ExtraSelection> *this)

{
  ExtraSelection *n;
  QArrayDataPointer<QTextEdit::ExtraSelection> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<QTextEdit::ExtraSelection> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QTextEdit::ExtraSelection> *)0x72e329);
  QArrayDataPointer<QTextEdit::ExtraSelection>::operator->(in_RDI);
  n = QArrayDataPointer<QTextEdit::ExtraSelection>::end(in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }